

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

exr_result_t exr_encoding_destroy(exr_const_context_t ctxt,exr_encode_pipeline_t *encode)

{
  exr_result_t eVar1;
  
  if (ctxt == (exr_const_context_t)0x0) {
    eVar1 = 2;
  }
  else if (encode == (exr_encode_pipeline_t *)0x0) {
    eVar1 = 0;
  }
  else {
    if (encode->channels != encode->_quick_chan_store) {
      (**(code **)(ctxt + 0x60))();
    }
    eVar1 = 0;
    internal_encode_free_buffer
              (encode,EXR_TRANSCODE_BUFFER_PACKED,&encode->packed_buffer,&encode->packed_alloc_size)
    ;
    internal_encode_free_buffer
              (encode,EXR_TRANSCODE_BUFFER_COMPRESSED,&encode->compressed_buffer,
               &encode->compressed_alloc_size);
    internal_encode_free_buffer
              (encode,EXR_TRANSCODE_BUFFER_SCRATCH1,&encode->scratch_buffer_1,
               &encode->scratch_alloc_size_1);
    internal_encode_free_buffer
              (encode,EXR_TRANSCODE_BUFFER_SCRATCH2,&encode->scratch_buffer_2,
               &encode->scratch_alloc_size_2);
    internal_encode_free_buffer
              (encode,EXR_TRANSCODE_BUFFER_PACKED_SAMPLES,&encode->packed_sample_count_table,
               &encode->packed_sample_count_alloc_size);
    memset(encode,0,0x1f8);
  }
  return eVar1;
}

Assistant:

exr_result_t
exr_encoding_destroy (exr_const_context_t ctxt, exr_encode_pipeline_t* encode)
{
    INTERN_EXR_PROMOTE_CONST_CONTEXT_OR_ERROR (ctxt);
    if (encode)
    {
        exr_encode_pipeline_t nil = {0};
        if (encode->channels != encode->_quick_chan_store)
            pctxt->free_fn (encode->channels);

        internal_encode_free_buffer (
            encode,
            EXR_TRANSCODE_BUFFER_PACKED,
            (void**) &(encode->packed_buffer),
            &(encode->packed_alloc_size));
        internal_encode_free_buffer (
            encode,
            EXR_TRANSCODE_BUFFER_COMPRESSED,
            &(encode->compressed_buffer),
            &(encode->compressed_alloc_size));
        internal_encode_free_buffer (
            encode,
            EXR_TRANSCODE_BUFFER_SCRATCH1,
            &(encode->scratch_buffer_1),
            &(encode->scratch_alloc_size_1));
        internal_encode_free_buffer (
            encode,
            EXR_TRANSCODE_BUFFER_SCRATCH2,
            &(encode->scratch_buffer_2),
            &(encode->scratch_alloc_size_2));
        internal_encode_free_buffer (
            encode,
            EXR_TRANSCODE_BUFFER_PACKED_SAMPLES,
            &(encode->packed_sample_count_table),
            &(encode->packed_sample_count_alloc_size));
        *encode = nil;
    }
    return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (EXR_ERR_SUCCESS);
}